

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O3

void __thiscall ExprTest_HashPLTerm_Test::TestBody(ExprTest_HashPLTerm_Test *this)

{
  ExprTest *this_00;
  bool bVar1;
  double *pdVar2;
  size_t sVar3;
  Reference arg;
  PLTerm expr;
  bool bVar4;
  ulong uVar5;
  char *message;
  double *pdVar6;
  AssertionResult gtest_ar;
  double breakpoints [2];
  double slopes [3];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  AssertHelper local_80;
  hash<double> local_78 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  double local_68;
  double dStack_60;
  ExprTest *local_58;
  ulong local_50;
  double local_48;
  double adStack_40 [2];
  
  local_68 = 5.0;
  dStack_60 = 10.0;
  local_48 = -1.0;
  adStack_40[0] = 0.0;
  adStack_40[1] = 1.0;
  uVar5 = 0x9e3779e1;
  pdVar6 = &local_68;
  pdVar2 = &local_48;
  bVar1 = true;
  local_58 = &this->super_ExprTest;
  do {
    bVar4 = bVar1;
    sVar3 = std::hash<double>::operator()(local_78,*pdVar2);
    uVar5 = uVar5 * 0x40 + 0x9e3779b9 + (uVar5 >> 2) + sVar3 ^ uVar5;
    sVar3 = std::hash<double>::operator()(local_78,*pdVar6);
    uVar5 = (uVar5 >> 2) + sVar3 + uVar5 * 0x40 + 0x9e3779b9 ^ uVar5;
    pdVar2 = adStack_40;
    pdVar6 = &dStack_60;
    bVar1 = false;
    local_50 = uVar5;
  } while (bVar4);
  sVar3 = std::hash<double>::operator()(local_78,1.0);
  this_00 = local_58;
  uVar5 = (uVar5 >> 2) + sVar3 + uVar5 * 0x40 + 0x9e3779b9 ^ uVar5;
  arg = mp::BasicExprFactory<std::allocator<char>_>::MakeReference
                  (&local_58->factory_,FIRST_REFERENCE,9);
  sVar3 = std::hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::operator()
                    ((hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)local_78,
                     (Expr)arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.
                           impl_);
  local_50 = (uVar5 >> 2) + sVar3 + uVar5 * 0x40 + 0x9e3779b9 ^ uVar5;
  expr = ExprTest::MakePLTerm(this_00,2,&local_68,&local_48,arg);
  local_88.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::operator()
                 ((hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)&local_80,
                  (Expr)expr.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                        impl_);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_78,"hash",
             "ExprHash()( MakePLTerm(NUM_BREAKPOINTS, breakpoints, slopes, var))",&local_50,
             (unsigned_long *)&local_88);
  if (local_78[0] == (hash<double>)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_70.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x40b
               ,message);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_88.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(ExprTest, HashPLTerm) {
  size_t hash = HashCombine<int>(0, expr::PLTERM);
  enum {NUM_BREAKPOINTS = 2};
  double breakpoints[NUM_BREAKPOINTS] = {5, 10};
  double slopes[NUM_BREAKPOINTS + 1] = {-1, 0, 1};
  for (size_t i = 0; i < NUM_BREAKPOINTS; ++i) {
    hash = HashCombine(hash, slopes[i]);
    hash = HashCombine(hash, breakpoints[i]);
  }
  hash = HashCombine(hash, slopes[NUM_BREAKPOINTS]);
  auto var = factory_.MakeVariable(9);
  hash = HashCombine<Expr>(hash, var);
  EXPECT_EQ(hash, ExprHash()(
    MakePLTerm(NUM_BREAKPOINTS, breakpoints, slopes, var)));
}